

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall
QMdiAreaPrivate::_q_processWindowStateChanged
          (QMdiAreaPrivate *this,WindowStates oldState,WindowStates newState)

{
  QObject *object;
  QMdiSubWindow *deactivatedWindow;
  
  if (this->ignoreWindowStateChange == false) {
    object = (QObject *)QObject::sender();
    deactivatedWindow = QtPrivate::qobject_cast_helper<QMdiSubWindow*,QObject>(object);
    if (deactivatedWindow != (QMdiSubWindow *)0x0) {
      if (((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 8) == 0) {
        if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                   super_QFlagsStorage<Qt::WindowState>.i & 8) != 0) {
          emitWindowActivated(this,deactivatedWindow);
        }
      }
      else if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                      super_QFlagsStorage<Qt::WindowState>.i & 8) == 0) {
        resetActiveWindow(this,deactivatedWindow);
      }
      if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 1) != 0 &&
          ((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 1) == 0) {
        this->isSubWindowsTiled = false;
LAB_0040b758:
        arrangeMinimizedSubWindows(this);
        return;
      }
      if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 2) != 0 &&
          (char)(((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                        super_QFlagsStorage<Qt::WindowState>.i & 2) >> 1) == '\0') {
        internalRaise(this,deactivatedWindow);
        return;
      }
      if (((uint)newState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                 super_QFlagsStorage<Qt::WindowState>.i & 3) == 0) {
        internalRaise(this,deactivatedWindow);
        if (((uint)oldState.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                   super_QFlagsStorage<Qt::WindowState>.i & 1) != 0) goto LAB_0040b758;
      }
    }
  }
  return;
}

Assistant:

void QMdiAreaPrivate::_q_processWindowStateChanged(Qt::WindowStates oldState,
                                                   Qt::WindowStates newState)
{
    if (ignoreWindowStateChange)
        return;

    Q_Q(QMdiArea);
    QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(q->sender());
    if (!child)
        return;

    // windowActivated
    if (!(oldState & Qt::WindowActive) && (newState & Qt::WindowActive))
        emitWindowActivated(child);
    // windowDeactivated
    else if ((oldState & Qt::WindowActive) && !(newState & Qt::WindowActive))
        resetActiveWindow(child);

    // windowMinimized
    if (!(oldState & Qt::WindowMinimized) && (newState & Qt::WindowMinimized)) {
        isSubWindowsTiled = false;
        arrangeMinimizedSubWindows();
    // windowMaximized
    } else if (!(oldState & Qt::WindowMaximized) && (newState & Qt::WindowMaximized)) {
        internalRaise(child);
    // windowRestored
    } else if (!(newState & (Qt::WindowMaximized | Qt::WindowMinimized))) {
        internalRaise(child);
        if (oldState & Qt::WindowMinimized)
            arrangeMinimizedSubWindows();
    }
}